

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void DeleteObservation(pyhanabi_observation_t *observation)

{
  HanabiObservation *this;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/pyhanabi.cc"
                  ,0x26a,"void DeleteObservation(pyhanabi_observation_t *)");
  }
  this = (HanabiObservation *)observation->observation;
  if (this != (HanabiObservation *)0x0) {
    hanabi_learning_env::HanabiObservation::~HanabiObservation(this);
    operator_delete(this);
    observation->observation = (void *)0x0;
    return;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/pyhanabi.cc"
                ,0x26b,"void DeleteObservation(pyhanabi_observation_t *)");
}

Assistant:

void DeleteObservation(pyhanabi_observation_t* observation) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  delete reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
      observation->observation);
  observation->observation = nullptr;
}